

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

void lddmc_fprintdot_rec(FILE *out,MDD mdd)

{
  uint uVar1;
  uint8_t *puVar2;
  long lVar3;
  ulong *puVar4;
  ulong uVar5;
  
  uVar5 = *(ulong *)(nodes->data + mdd * 0x10);
  if ((uVar5 & 1) == 0) {
    puVar4 = (ulong *)(nodes->data + mdd * 0x10);
    *puVar4 = uVar5 | 1;
    uVar1 = *(uint *)((long)puVar4 + 6);
    fprintf((FILE *)out,"%lu [shape=record, label=\"",mdd);
    if ((*(byte *)((long)puVar4 + 10) & 1) == 0) {
      fprintf((FILE *)out,"<%u> %u",(ulong)uVar1,(ulong)uVar1);
    }
    else {
      fwrite("<c> *",5,1,(FILE *)out);
    }
    uVar5 = *puVar4;
    while (uVar5 = uVar5 >> 1 & 0x7fffffffffff, uVar5 != 0) {
      lVar3 = uVar5 * 0x10;
      puVar2 = nodes->data;
      fprintf((FILE *)out,"|<%u> %u",(ulong)*(uint *)(puVar2 + lVar3 + 6));
      uVar5 = *(ulong *)(puVar2 + lVar3);
    }
    fwrite("\"];\n",4,1,(FILE *)out);
    while( true ) {
      if (0x3ffff < puVar4[1]) {
        uVar5 = puVar4[1] >> 0x11;
        lddmc_fprintdot_rec(out,uVar5);
        if ((*(byte *)((long)puVar4 + 10) & 1) == 0) {
          fprintf((FILE *)out,"%lu:%u -> ",mdd,(ulong)*(uint *)((long)puVar4 + 6));
        }
        else {
          fprintf((FILE *)out,"%lu:c -> ",mdd);
        }
        if ((nodes->data[uVar5 * 0x10 + 10] & 1) == 0) {
          fprintf((FILE *)out,"%lu:%u [style=solid];\n",uVar5,
                  (ulong)*(uint *)(nodes->data + uVar5 * 0x10 + 6));
        }
        else {
          fprintf((FILE *)out,"%lu:c [style=solid];\n",uVar5);
        }
      }
      uVar5 = *puVar4 >> 1 & 0x7fffffffffff;
      if (uVar5 == 0) break;
      puVar4 = (ulong *)(nodes->data + uVar5 * 0x10);
    }
  }
  return;
}

Assistant:

static void
lddmc_fprintdot_rec(FILE* out, MDD mdd)
{
    // assert(mdd > lddmc_true);

    // check mark
    mddnode_t n = LDD_GETNODE(mdd);
    if (mddnode_getmark(n)) return;
    mddnode_setmark(n, 1);

    // print the node
    uint32_t val = mddnode_getvalue(n);
    fprintf(out, "%" PRIu64 " [shape=record, label=\"", mdd);
    if (mddnode_getcopy(n)) fprintf(out, "<c> *");
    else fprintf(out, "<%u> %u", val, val);
    MDD right = mddnode_getright(n);
    while (right != lddmc_false) {
        mddnode_t n2 = LDD_GETNODE(right);
        uint32_t val2 = mddnode_getvalue(n2);
        fprintf(out, "|<%u> %u", val2, val2);
        right = mddnode_getright(n2);
        // assert(right != lddmc_true);
    }
    fprintf(out, "\"];\n");

    // recurse and print the edges
    for (;;) {
        MDD down = mddnode_getdown(n);
        // assert(down != lddmc_false);
        if (down > lddmc_true) {
            lddmc_fprintdot_rec(out, down);
            if (mddnode_getcopy(n)) {
                fprintf(out, "%" PRIu64 ":c -> ", mdd);
            } else {
                fprintf(out, "%" PRIu64 ":%u -> ", mdd, mddnode_getvalue(n));
            }
            if (mddnode_getcopy(LDD_GETNODE(down))) {
                fprintf(out, "%" PRIu64 ":c [style=solid];\n", down);
            } else {
                fprintf(out, "%" PRIu64 ":%u [style=solid];\n", down, mddnode_getvalue(LDD_GETNODE(down)));
            }
        }
        MDD right = mddnode_getright(n);
        if (right == lddmc_false) break;
        n = LDD_GETNODE(right);
    }
}